

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

cio_error cio_websocket_read_message
                    (cio_websocket *websocket,cio_websocket_read_handler_t handler,
                    void *handler_context)

{
  cio_http_client *pcVar1;
  cio_error local_34;
  cio_error err;
  cio_http_client *client;
  void *handler_context_local;
  cio_websocket_read_handler_t handler_local;
  cio_websocket *websocket_local;
  
  if ((websocket == (cio_websocket *)0x0) || (handler == (cio_websocket_read_handler_t)0x0)) {
    websocket_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else {
    (websocket->ws_private).read_handler = handler;
    (websocket->ws_private).read_handler_context = handler_context;
    pcVar1 = (websocket->ws_private).http_client;
    if ((websocket->ws_private).remaining_read_frame_length == 0) {
      local_34 = cio_buffered_stream_read_at_least
                           (&pcVar1->buffered_stream,&pcVar1->rb,1,get_header,websocket);
    }
    else {
      local_34 = cio_buffered_stream_read_at_most
                           (&pcVar1->buffered_stream,&pcVar1->rb,
                            (websocket->ws_private).remaining_read_frame_length,get_payload,
                            websocket);
    }
    if (local_34 != CIO_SUCCESS) {
      handle_error(websocket,local_34,CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR,
                   "error while start reading websocket header");
    }
    websocket_local._4_4_ = CIO_SUCCESS;
  }
  return websocket_local._4_4_;
}

Assistant:

enum cio_error cio_websocket_read_message(struct cio_websocket *websocket, cio_websocket_read_handler_t handler, void *handler_context)
{
	if (cio_unlikely((websocket == NULL)) || (handler == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	websocket->ws_private.read_handler = handler;
	websocket->ws_private.read_handler_context = handler_context;
	struct cio_http_client *client = websocket->ws_private.http_client;
	enum cio_error err = CIO_SUCCESS;

	if (websocket->ws_private.remaining_read_frame_length == 0) {
		err = cio_buffered_stream_read_at_least(&client->buffered_stream, &client->rb, 1, get_header, websocket);
	} else {
		err = cio_buffered_stream_read_at_most(&client->buffered_stream, &client->rb, websocket->ws_private.remaining_read_frame_length, get_payload, websocket);
	}

	if (cio_unlikely(err != CIO_SUCCESS)) {
		handle_error(websocket, err, CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, "error while start reading websocket header");
	}

	return CIO_SUCCESS;
}